

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O3

int run_test_getaddrinfo_basic_sync(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined4 *puVar3;
  int *piVar4;
  undefined8 extraout_RDX;
  long extraout_RDX_00;
  undefined8 unaff_RBX;
  uv_getaddrinfo_t *puVar5;
  size_t *psVar6;
  long *plVar7;
  int *piVar8;
  long lVar9;
  int64_t eval_b;
  int64_t eval_a;
  uv_getaddrinfo_t req;
  long lStack_100;
  uv_getaddrinfo_t *puStack_f8;
  long lStack_f0;
  long lStack_e8;
  undefined8 uStack_e0;
  undefined1 local_a8 [144];
  undefined8 local_18;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar2,local_a8,0,"localhost",0,0);
  if (iVar1 == 0) {
    uv_freeaddrinfo(local_18);
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  puVar5 = getaddrinfo_handles;
  piVar8 = callback_counts;
  lVar9 = 0;
  uStack_e0 = unaff_RBX;
  do {
    *piVar8 = 0;
    puStack_f8 = (uv_getaddrinfo_t *)0x19d2ce;
    puVar3 = (undefined4 *)malloc(4);
    if (puVar3 == (undefined4 *)0x0) {
      puStack_f8 = (uv_getaddrinfo_t *)0x19d3cd;
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0019d3cd:
      puStack_f8 = (uv_getaddrinfo_t *)0x19d3da;
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_0019d3da;
    }
    *puVar3 = (int)lVar9;
    puVar5->data = puVar3;
    puStack_f8 = (uv_getaddrinfo_t *)0x19d2e2;
    uVar2 = uv_default_loop();
    puStack_f8 = (uv_getaddrinfo_t *)0x19d2f9;
    iVar1 = uv_getaddrinfo(uVar2,puVar5,getaddrinfo_cuncurrent_cb,"localhost",0,0);
    lStack_e8 = (long)iVar1;
    lStack_f0 = 0;
    if (lStack_e8 != 0) goto LAB_0019d3cd;
    lVar9 = lVar9 + 1;
    puVar5 = puVar5 + 1;
    piVar8 = piVar8 + 1;
  } while (lVar9 != 10);
  puStack_f8 = (uv_getaddrinfo_t *)0x19d330;
  uVar2 = uv_default_loop();
  puVar5 = (uv_getaddrinfo_t *)0x0;
  puStack_f8 = (uv_getaddrinfo_t *)0x19d33c;
  uv_run(uVar2,0);
  do {
    lStack_e8 = 1;
    lStack_f0 = (long)*(int *)(puVar5[0x5771].reserved + 3);
    if (lStack_f0 != 1) goto LAB_0019d3da;
    puVar5 = (uv_getaddrinfo_t *)((long)&puVar5->data + 4);
  } while (puVar5 != (uv_getaddrinfo_t *)0x28);
  puStack_f8 = (uv_getaddrinfo_t *)0x19d36e;
  puVar5 = (uv_getaddrinfo_t *)uv_default_loop();
  puStack_f8 = (uv_getaddrinfo_t *)0x19d382;
  uv_walk(puVar5,close_walk_cb,0);
  puStack_f8 = (uv_getaddrinfo_t *)0x19d38c;
  uv_run(puVar5,0);
  lStack_e8 = 0;
  puStack_f8 = (uv_getaddrinfo_t *)0x19d39a;
  uVar2 = uv_default_loop();
  puStack_f8 = (uv_getaddrinfo_t *)0x19d3a2;
  iVar1 = uv_loop_close(uVar2);
  lStack_f0 = (long)iVar1;
  if (lStack_e8 == lStack_f0) {
    puStack_f8 = (uv_getaddrinfo_t *)0x19d3b8;
    uv_library_shutdown();
    return 0;
  }
LAB_0019d3e7:
  plVar7 = &lStack_e8;
  puStack_f8 = (uv_getaddrinfo_t *)getaddrinfo_cuncurrent_cb;
  run_test_getaddrinfo_concurrent_cold_3();
  piVar8 = (int *)*plVar7;
  piVar4 = callback_counts;
  psVar6 = &sendfile_req.bufsml[1].len;
  lStack_100 = 0;
  do {
    psVar6 = psVar6 + 0x14;
    puStack_f8 = puVar5;
    if (psVar6 == (size_t *)plVar7) goto LAB_0019d430;
    piVar4 = piVar4 + 1;
    lStack_100 = lStack_100 + 1;
  } while (lStack_100 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lStack_100 = extraout_RDX_00;
LAB_0019d430:
  if (lStack_100 == *piVar8) {
    *piVar4 = *piVar4 + 1;
    free(piVar8);
    iVar1 = uv_freeaddrinfo(extraout_RDX);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return iVar1;
  }
  plVar7 = &lStack_100;
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(plVar7,0);
  return iVar1;
LAB_0019d3da:
  puStack_f8 = (uv_getaddrinfo_t *)0x19d3e7;
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0019d3e7;
}

Assistant:

TEST_IMPL(getaddrinfo_basic_sync) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif
  uv_getaddrinfo_t req;

  ASSERT_OK(uv_getaddrinfo(uv_default_loop(),
                           &req,
                           NULL,
                           name,
                           NULL,
                           NULL));
  uv_freeaddrinfo(req.addrinfo);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}